

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vfnmsub213ss_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  undefined8 uVar2;
  
  if ((pMyDisasm->Prefix).OperandSize != '\x01') {
LAB_0012b550:
    failDecode(pMyDisasm);
    return;
  }
  (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
  (pMyDisasm->Prefix).OperandSize = '\b';
  UVar1 = (pMyDisasm->Reserved_).EVEX.state;
  if (UVar1 == '\x01') {
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
  }
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') goto LAB_0012b550;
  if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
    if (UVar1 == '\x01') goto LAB_0012b55d;
LAB_0012b572:
    uVar2 = 0x73733331326275;
  }
  else {
    if (UVar1 == '\x01') {
LAB_0012b55d:
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') goto LAB_0012b572;
    }
    uVar2 = 0x64733331326275;
  }
  *(undefined8 *)((pMyDisasm->Instruction).Mnemonic + 5) = uVar2;
  (pMyDisasm->Instruction).Mnemonic[0] = 'v';
  (pMyDisasm->Instruction).Mnemonic[1] = 'f';
  (pMyDisasm->Instruction).Mnemonic[2] = 'n';
  (pMyDisasm->Instruction).Mnemonic[3] = 'm';
  (pMyDisasm->Instruction).Mnemonic[4] = 's';
  (pMyDisasm->Instruction).Mnemonic[5] = 'u';
  (pMyDisasm->Instruction).Mnemonic[6] = 'b';
  (pMyDisasm->Instruction).Mnemonic[7] = '2';
  ArgsVEX(pMyDisasm);
  (pMyDisasm->Operand1).AccessMode = 3;
  return;
}

Assistant:

void __bea_callspec__ vfnmsub213ss_(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
       if (GV.VEX.state == InUsePrefix) {
         if (((GV.REX.W_ == 0x0) && (GV.EVEX.state != InUsePrefix)) || ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))) {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfnmsub213ss");
           #endif
         } else {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfnmsub213sd");
           #endif

         }
         ArgsVEX(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;
       } else {
         failDecode(pMyDisasm);
       }
   }
   else {
       failDecode(pMyDisasm);
   }
}